

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.cpp
# Opt level: O3

void __thiscall pbrt::StatsAccumulator::WritePixelImages(StatsAccumulator *this)

{
  optional<float> oVar1;
  pointer pIVar2;
  undefined1 auVar3 [16];
  StatsAccumulator *pSVar4;
  undefined8 uVar5;
  undefined1 auVar6 [64];
  undefined8 uVar7;
  undefined1 auVar8 [56];
  undefined1 auVar9 [40];
  bool bVar10;
  long *plVar11;
  Stats *pSVar12;
  Tuple2<pbrt::Point2,_int> TVar13;
  long *plVar14;
  size_type *psVar15;
  ulong uVar16;
  optional<float> oVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  ulong uVar21;
  Image *pIVar22;
  long lVar23;
  Float FVar24;
  uint uVar25;
  undefined1 auVar26 [64];
  string n;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string local_190;
  long *local_170 [2];
  long local_160 [2];
  StatsAccumulator *local_150;
  ulong local_148;
  ulong local_140;
  undefined1 local_138 [24];
  long lStack_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined1 auStack_108 [16];
  undefined1 local_f8 [64];
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  aligned_storage_t<sizeof(pbrt::Bounds2<int>),_alignof(pbrt::Bounds2<int>)> aStack_a8;
  undefined8 uStack_98;
  undefined8 local_90;
  optional<int> oStack_88;
  optional<float> oStack_80;
  aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
  aStack_78;
  undefined8 uStack_70;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  _Stack_68;
  
  pSVar12 = this->stats;
  local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_190,pixelStatsBaseName_abi_cxx11_,
             DAT_030d1b68 + pixelStatsBaseName_abi_cxx11_);
  std::__cxx11::string::append((char *)&local_190);
  _Stack_68._M_impl.super__Rb_tree_header._M_header._M_left =
       &_Stack_68._M_impl.super__Rb_tree_header._M_header;
  aStack_78 = (aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
               )0x0;
  uStack_70._0_1_ = false;
  uStack_70._1_7_ = 0;
  _Stack_68._M_impl._0_8_ = 0;
  _Stack_68._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  _Stack_68._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  _Stack_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  uStack_b8 = 0;
  uStack_b0 = 0;
  aStack_a8._0_8_ = 0;
  aStack_a8._8_8_ = 0;
  uStack_98 = 0;
  local_90 = 0;
  oStack_88.optionalValue = (aligned_storage_t<sizeof(int),_alignof(int)>)0x0;
  oStack_88.set = false;
  oStack_88._5_3_ = 0;
  oStack_80.optionalValue = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
  oStack_80.set = false;
  oStack_80._5_3_ = 0;
  local_f8 = ZEXT1664(ZEXT816(0));
  local_138._0_16_ = ZEXT816(0);
  _local_138 = ZEXT1664(local_138._0_16_);
  _Stack_68._M_impl.super__Rb_tree_header._M_node_count = 0;
  _Stack_68._M_impl.super__Rb_tree_header._M_header._M_right =
       _Stack_68._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar10 = Image::Write(&pSVar12->pixelTime,&local_190,(ImageMetadata *)local_138);
  if (!bVar10) {
    LogFatal<char_const(&)[57]>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/stats.cpp"
               ,0x1c1,"Check failed: %s",
               (char (*) [57])"stats->pixelTime.Write(pixelStatsBaseName + \"-time.exr\")");
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::~_Rb_tree(&_Stack_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
  }
  pSVar12 = this->stats;
  local_150 = this;
  if ((pSVar12->pixelCounterImages).super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (pSVar12->pixelCounterImages).super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    uVar21 = 0;
    do {
      pSVar4 = local_150;
      local_170[0] = local_160;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_170,pixelStatsBaseName_abi_cxx11_,
                 DAT_030d1b68 + pixelStatsBaseName_abi_cxx11_);
      std::__cxx11::string::append((char *)local_170);
      plVar11 = (long *)std::__cxx11::string::_M_append
                                  ((char *)local_170,
                                   (ulong)(pSVar4->stats->pixelCounterNames).
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start[uVar21].
                                          _M_dataplus._M_p);
      auVar6 = _local_138;
      auVar8 = stack0xfffffffffffffed0;
      local_138._0_8_ = (long)local_138 + 0x10;
      auVar26 = _local_138;
      plVar14 = plVar11 + 2;
      _lStack_120 = auVar6._24_40_;
      auVar9 = _lStack_120;
      if ((long *)*plVar11 == plVar14) {
        local_138._0_16_ = auVar26._0_16_;
        local_138._16_8_ = *plVar14;
        _uStack_118 = auVar6._32_32_;
        lStack_120 = plVar11[3];
      }
      else {
        local_138._0_8_ = (long *)*plVar11;
        _local_138 = CONCAT568(auVar8,local_138._0_8_);
        local_138._16_8_ = *plVar14;
        _local_138 = CONCAT4024(auVar9,local_138);
      }
      local_138._8_8_ = plVar11[1];
      *plVar11 = (long)plVar14;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      plVar11 = (long *)std::__cxx11::string::append(local_138);
      psVar15 = (size_type *)(plVar11 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar11 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar15) {
        local_190.field_2._M_allocated_capacity = *psVar15;
        local_190.field_2._8_8_ = plVar11[3];
        local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
      }
      else {
        local_190.field_2._M_allocated_capacity = *psVar15;
        local_190._M_dataplus._M_p = (pointer)*plVar11;
      }
      local_190._M_string_length = plVar11[1];
      *plVar11 = (long)psVar15;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      if (local_138._0_8_ != (long)local_138 + 0x10) {
        operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
      }
      if (local_170[0] != local_160) {
        operator_delete(local_170[0],local_160[0] + 1);
      }
      if (local_190._M_string_length != 0) {
        uVar16 = 0;
        do {
          if (local_190._M_dataplus._M_p[uVar16] == '/') {
            local_190._M_dataplus._M_p[uVar16] = '_';
          }
          uVar16 = uVar16 + 1;
        } while (uVar16 < local_190._M_string_length);
      }
      pIVar2 = (pSVar4->stats->pixelCounterImages).
               super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>._M_impl.
               super__Vector_impl_data._M_start;
      TVar13 = pIVar2[uVar21].resolution.super_Tuple2<pbrt::Point2,_int>;
      local_148 = uVar21;
      if (0 < TVar13.y) {
        pIVar22 = pIVar2 + uVar21;
        lVar20 = 0;
        lVar23 = 0;
        do {
          if (0 < TVar13.x) {
            lVar19 = 0;
            do {
              FVar24 = Image::GetChannel(pIVar22,(Point2i)(lVar20 + lVar19),0,
                                         (WrapMode2D)0x200000002);
              if ((FVar24 != 0.0) || (NAN(FVar24))) {
                _local_138 = ZEXT1264(ZEXT812(0));
                _Stack_68._M_impl.super__Rb_tree_header._M_header._M_left =
                     &_Stack_68._M_impl.super__Rb_tree_header._M_header;
                aStack_78 = (aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
                             )0x0;
                uStack_70._0_1_ = false;
                uStack_70._1_7_ = 0;
                _Stack_68._M_impl._0_8_ = 0;
                _Stack_68._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
                _Stack_68._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
                _Stack_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
                uStack_b8 = 0;
                uStack_b0 = 0;
                aStack_a8._0_8_ = 0;
                aStack_a8._8_8_ = 0;
                uStack_98 = 0;
                local_90 = 0;
                oStack_88.optionalValue = (aligned_storage_t<sizeof(int),_alignof(int)>)0x0;
                oStack_88.set = false;
                oStack_88._5_3_ = 0;
                oStack_80.optionalValue = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
                oStack_80.set = false;
                oStack_80._5_3_ = 0;
                _Stack_68._M_impl.super__Rb_tree_header._M_node_count = 0;
                local_f8 = _local_138;
                _Stack_68._M_impl.super__Rb_tree_header._M_header._M_right =
                     _Stack_68._M_impl.super__Rb_tree_header._M_header._M_left;
                bVar10 = Image::Write((local_150->stats->pixelCounterImages).
                                      super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>.
                                      _M_impl.super__Vector_impl_data._M_start + uVar21,&local_190,
                                      (ImageMetadata *)local_138);
                if (!bVar10) {
                  LogFatal<char_const(&)[38]>
                            (Fatal,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/stats.cpp"
                             ,0x1d1,"Check failed: %s",
                             (char (*) [38])"stats->pixelCounterImages[i].Write(n)");
                }
                std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                ::~_Rb_tree(&_Stack_68);
                goto LAB_00303ec3;
              }
              TVar13 = (pIVar22->resolution).super_Tuple2<pbrt::Point2,_int>;
              lVar19 = lVar19 + 1;
            } while (lVar19 < TVar13.x);
          }
          lVar23 = lVar23 + 1;
          lVar20 = lVar20 + 0x100000000;
        } while (lVar23 < (long)TVar13 >> 0x20);
      }
LAB_00303ec3:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_dataplus._M_p != &local_190.field_2) {
        operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
      }
      pSVar12 = local_150->stats;
      uVar21 = local_148 + 1;
    } while (uVar21 < (ulong)(((long)(pSVar12->pixelCounterImages).
                                     super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                               (long)(pSVar12->pixelCounterImages).
                                     super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>.
                                     _M_impl.super__Vector_impl_data._M_start >> 3) *
                             -0x5075075075075075));
  }
  if ((pSVar12->pixelRatioImages).super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (pSVar12->pixelRatioImages).super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    oVar1 = (optional<float>)((long)local_138 + 0x10);
    uVar21 = 0;
    do {
      pSVar4 = local_150;
      local_170[0] = local_160;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_170,pixelStatsBaseName_abi_cxx11_,
                 DAT_030d1b68 + pixelStatsBaseName_abi_cxx11_);
      std::__cxx11::string::append((char *)local_170);
      plVar11 = (long *)std::__cxx11::string::_M_append
                                  ((char *)local_170,
                                   (ulong)(pSVar4->stats->pixelRatioNames).
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start[uVar21].
                                          _M_dataplus._M_p);
      auVar6 = _local_138;
      auVar8 = stack0xfffffffffffffed0;
      local_138._0_8_ = oVar1;
      auVar26 = _local_138;
      plVar14 = plVar11 + 2;
      _lStack_120 = auVar6._24_40_;
      auVar9 = _lStack_120;
      if ((long *)*plVar11 == plVar14) {
        local_138._0_16_ = auVar26._0_16_;
        local_138._16_8_ = *plVar14;
        _uStack_118 = auVar6._32_32_;
        lStack_120 = plVar11[3];
      }
      else {
        local_138._0_8_ = (long *)*plVar11;
        _local_138 = CONCAT568(auVar8,local_138._0_8_);
        local_138._16_8_ = *plVar14;
        _local_138 = CONCAT4024(auVar9,local_138);
      }
      local_138._8_8_ = plVar11[1];
      *plVar11 = (long)plVar14;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      plVar11 = (long *)std::__cxx11::string::append(local_138);
      psVar15 = (size_type *)(plVar11 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar11 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar15) {
        local_190.field_2._M_allocated_capacity = *psVar15;
        local_190.field_2._8_8_ = plVar11[3];
        local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
      }
      else {
        local_190.field_2._M_allocated_capacity = *psVar15;
        local_190._M_dataplus._M_p = (pointer)*plVar11;
      }
      local_190._M_string_length = plVar11[1];
      *plVar11 = (long)psVar15;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      if ((optional<float>)local_138._0_8_ != oVar1) {
        operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
      }
      if (local_170[0] != local_160) {
        operator_delete(local_170[0],local_160[0] + 1);
      }
      if (local_190._M_string_length != 0) {
        uVar16 = 0;
        do {
          if (local_190._M_dataplus._M_p[uVar16] == '/') {
            local_190._M_dataplus._M_p[uVar16] = '_';
          }
          uVar16 = uVar16 + 1;
        } while (uVar16 < local_190._M_string_length);
      }
      pIVar2 = (pSVar4->stats->pixelRatioImages).
               super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>._M_impl.
               super__Vector_impl_data._M_start;
      TVar13 = pIVar2[uVar21].resolution.super_Tuple2<pbrt::Point2,_int>;
      local_140 = uVar21;
      if (0 < TVar13.y) {
        pIVar22 = pIVar2 + uVar21;
        lVar20 = 0;
        do {
          if (0 < TVar13.x) {
            lVar23 = 0;
            do {
              Image::GetChannels((ImageChannelValues *)local_138,pIVar22,
                                 (Point2i)(lVar23 + (lVar20 << 0x20)),(WrapMode2D)0x200000002);
              auVar6 = _local_138;
              uVar7 = local_138._8_8_;
              oVar17 = (optional<float>)local_138._8_8_;
              if ((optional<float>)local_138._8_8_ == (optional<float>)0x0) {
                oVar17 = oVar1;
              }
              uVar25 = *(uint *)oVar17;
              auVar26 = ZEXT464(uVar25);
              if (1 < (ulong)uStack_110) {
                uVar16 = 1;
                do {
                  lVar19 = uVar16 * 4;
                  uVar16 = uVar16 + 1;
                  auVar3 = vmaxss_avx(ZEXT416(*(uint *)((long)oVar17 + lVar19)),auVar26._0_16_);
                  auVar26 = ZEXT1664(auVar3);
                  uVar25 = auVar3._0_4_;
                } while (uStack_110 != uVar16);
              }
              uStack_110 = 0;
              auVar26 = _local_138;
              local_148 = CONCAT44(local_148._4_4_,uVar25);
              local_138._0_8_ = auVar6._0_8_;
              uVar5 = local_138._0_8_;
              uStack_118 = auVar6._32_8_;
              lVar19 = *(long *)local_138._0_8_;
              lVar18 = uStack_118 << 2;
              _local_138 = auVar26;
              (**(code **)(lVar19 + 0x18))(uVar5,uVar7,lVar18,4);
              if (((float)local_148 != 0.0) || (NAN((float)local_148))) {
                _local_138 = ZEXT1264(ZEXT812(0));
                _Stack_68._M_impl.super__Rb_tree_header._M_header._M_left =
                     &_Stack_68._M_impl.super__Rb_tree_header._M_header;
                aStack_78 = (aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
                             )0x0;
                uStack_70._0_1_ = false;
                uStack_70._1_7_ = 0;
                _Stack_68._M_impl._0_8_ = 0;
                _Stack_68._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
                _Stack_68._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
                _Stack_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
                uStack_b8 = 0;
                uStack_b0 = 0;
                aStack_a8._0_8_ = 0;
                aStack_a8._8_8_ = 0;
                uStack_98 = 0;
                local_90 = 0;
                oStack_88.optionalValue = (aligned_storage_t<sizeof(int),_alignof(int)>)0x0;
                oStack_88.set = false;
                oStack_88._5_3_ = 0;
                oStack_80.optionalValue = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
                oStack_80.set = false;
                oStack_80._5_3_ = 0;
                _Stack_68._M_impl.super__Rb_tree_header._M_node_count = 0;
                local_f8 = _local_138;
                _Stack_68._M_impl.super__Rb_tree_header._M_header._M_right =
                     _Stack_68._M_impl.super__Rb_tree_header._M_header._M_left;
                bVar10 = Image::Write((local_150->stats->pixelRatioImages).
                                      super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>.
                                      _M_impl.super__Vector_impl_data._M_start + uVar21,&local_190,
                                      (ImageMetadata *)local_138);
                if (!bVar10) {
                  LogFatal<char_const(&)[36]>
                            (Fatal,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/stats.cpp"
                             ,0x1e2,"Check failed: %s",
                             (char (*) [36])"stats->pixelRatioImages[i].Write(n)");
                }
                std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                ::~_Rb_tree(&_Stack_68);
                goto LAB_0030421e;
              }
              TVar13 = (pIVar22->resolution).super_Tuple2<pbrt::Point2,_int>;
              lVar23 = lVar23 + 1;
            } while (lVar23 < TVar13.x);
          }
          lVar20 = lVar20 + 1;
        } while (lVar20 < (long)TVar13 >> 0x20);
      }
LAB_0030421e:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_dataplus._M_p != &local_190.field_2) {
        operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
      }
      uVar21 = local_140 + 1;
    } while (uVar21 < (ulong)(((long)(local_150->stats->pixelRatioImages).
                                     super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                               (long)(local_150->stats->pixelRatioImages).
                                     super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>.
                                     _M_impl.super__Vector_impl_data._M_start >> 3) *
                             -0x5075075075075075));
  }
  return;
}

Assistant:

void StatsAccumulator::WritePixelImages() const {
    // FIXME: do this where?
    CHECK(stats->pixelTime.Write(pixelStatsBaseName + "-time.exr"));

    for (size_t i = 0; i < stats->pixelCounterImages.size(); ++i) {
        std::string n = pixelStatsBaseName + "-" + stats->pixelCounterNames[i] + ".exr";
        for (size_t j = 0; j < n.size(); ++j)
            if (n[j] == '/')
                n[j] = '_';

        auto AllZero = [](const Image &im) {
            for (int y = 0; y < im.Resolution().y; ++y)
                for (int x = 0; x < im.Resolution().x; ++x)
                    if (im.GetChannel({x, y}, 0) != 0)
                        return false;
            return true;
        };
        if (!AllZero(stats->pixelCounterImages[i]))
            CHECK(stats->pixelCounterImages[i].Write(n));
    }

    for (size_t i = 0; i < stats->pixelRatioImages.size(); ++i) {
        std::string n = pixelStatsBaseName + "-" + stats->pixelRatioNames[i] + ".exr";
        for (size_t j = 0; j < n.size(); ++j)
            if (n[j] == '/')
                n[j] = '_';

        auto AllZero = [](const Image &im) {
            for (int y = 0; y < im.Resolution().y; ++y)
                for (int x = 0; x < im.Resolution().x; ++x)
                    if (im.GetChannels({x, y}).MaxValue() != 0)
                        return false;
            return true;
        };
        if (!AllZero(stats->pixelRatioImages[i]))
            CHECK(stats->pixelRatioImages[i].Write(n));
    }
}